

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void __thiscall
testing::ScopedFakeTestPartResultReporter::Init(ScopedFakeTestPartResultReporter *this)

{
  UnitTestImpl *this_00;
  TestPartResultReporterInterface *pTVar1;
  TestPartResultReporterInterface **ppTVar2;
  ThreadLocal<testing::TestPartResultReporterInterface_*> *this_01;
  
  UnitTest::GetInstance();
  this_00 = UnitTest::GetInstance::instance.impl_;
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    pTVar1 = internal::UnitTestImpl::GetGlobalTestPartResultReporter
                       (UnitTest::GetInstance::instance.impl_);
    this->old_reporter_ = pTVar1;
    internal::UnitTestImpl::SetGlobalTestPartResultReporter
              (this_00,&this->super_TestPartResultReporterInterface);
    return;
  }
  this_01 = &(UnitTest::GetInstance::instance.impl_)->per_thread_test_part_result_reporter_;
  ppTVar2 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (this_01);
  this->old_reporter_ = *ppTVar2;
  ppTVar2 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (this_01);
  *ppTVar2 = &this->super_TestPartResultReporterInterface;
  return;
}

Assistant:

void ScopedFakeTestPartResultReporter::Init() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    old_reporter_ = impl->GetGlobalTestPartResultReporter();
    impl->SetGlobalTestPartResultReporter(this);
  } else {
    old_reporter_ = impl->GetTestPartResultReporterForCurrentThread();
    impl->SetTestPartResultReporterForCurrentThread(this);
  }
}